

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

void __thiscall
udpdiscovery::impl::PeerEnv::processReceivedBuffer
          (PeerEnv *this,long cur_time_ms,IpPort *from,string *buffer)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *this_00;
  SamePeerMode mode;
  bool bVar1;
  ProtocolVersion PVar2;
  _List_node_base *p_Var3;
  iterator __position;
  Packet packet;
  Packet local_a0;
  value_type local_68;
  
  local_a0.user_data_._M_dataplus._M_p = (pointer)&local_a0.user_data_.field_2;
  local_a0.user_data_._M_string_length = 0;
  local_a0.user_data_.field_2._M_local_buf[0] = '\0';
  PVar2 = Packet::Parse(&local_a0,buffer);
  if (((((int)(this->parameters_).min_supported_protocol_version_ <= (int)PVar2) &&
       (PVar2 != kProtocolVersionUnknown)) &&
      ((int)PVar2 <= (int)(this->parameters_).max_supported_protocol_version_)) &&
     (((this->parameters_).application_id_ == local_a0.application_id_ &&
      (((this->parameters_).discover_self_ != false || (local_a0.peer_id_ != this->peer_id_)))))) {
    pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
    this_00 = &this->discovered_peers_;
    mode = (this->parameters_).same_peer_mode_;
    p_Var3 = (_List_node_base *)this_00;
    do {
      p_Var3 = p_Var3->_M_next;
      __position._M_node = (_List_node_base *)this_00;
      if (p_Var3 == (_List_node_base *)this_00) break;
      local_68.ip_port_ = (IpPort)p_Var3[1]._M_next;
      bVar1 = Same(mode,&local_68.ip_port_,from);
      __position._M_node = p_Var3;
    } while (!bVar1);
    if (local_a0.packet_type_ == '\x01') {
      if (__position._M_node != (_List_node_base *)this_00) {
        std::__cxx11::
        list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::erase
                  (this_00,__position);
      }
    }
    else if (local_a0.packet_type_ == '\0') {
      if (__position._M_node == (_List_node_base *)this_00) {
        local_68.user_data_._M_dataplus._M_p = (pointer)&local_68.user_data_.field_2;
        local_68.ip_port_.ip_ = 0;
        local_68.ip_port_.port_ = 0;
        local_68.last_updated_ = 0;
        local_68.user_data_._M_string_length = 0;
        local_68.user_data_.field_2._8_8_ = 0;
        local_68.last_received_packet_ = 0;
        local_68.user_data_.field_2._M_allocated_capacity = 0;
        std::__cxx11::
        list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::push_back
                  (this_00,&local_68);
        std::__cxx11::string::_M_dispose();
        (this->discovered_peers_).
        super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
        ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next = (_List_node_base *)*from;
        p_Var3 = (this->discovered_peers_).
                 super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::_M_assign((string *)&p_Var3[1]._M_prev);
        p_Var3[3]._M_prev = (_List_node_base *)local_a0.snapshot_index_;
        __position._M_node =
             (this->discovered_peers_).
             super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
      }
      else if (__position._M_node[3]._M_prev < local_a0.snapshot_index_) {
        std::__cxx11::string::_M_assign((string *)&__position._M_node[1]._M_prev);
        __position._M_node[3]._M_prev = (_List_node_base *)local_a0.snapshot_index_;
      }
      __position._M_node[4]._M_next = (_List_node_base *)cur_time_ms;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void processReceivedBuffer(long cur_time_ms, const IpPort& from,
                             const std::string& buffer) {
    Packet packet;

    ProtocolVersion packet_version = packet.Parse(buffer);
    bool is_supported_packet_version =
        (packet_version >= parameters_.min_supported_protocol_version() &&
         packet_version <= parameters_.max_supported_protocol_version());

    if (packet_version != kProtocolVersionUnknown &&
        is_supported_packet_version) {
      bool accept_packet = false;
      if (parameters_.application_id() == packet.application_id()) {
        if (!parameters_.discover_self()) {
          if (packet.peer_id() != peer_id_) {
            accept_packet = true;
          }
        } else {
          accept_packet = true;
        }
      }

      if (accept_packet) {
        lock_.Lock();

        std::list<DiscoveredPeer>::iterator find_it = discovered_peers_.end();
        for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
             it != discovered_peers_.end(); ++it) {
          if (Same(parameters_.same_peer_mode(), (*it).ip_port(), from)) {
            find_it = it;
            break;
          }
        }

        if (packet.packet_type() == kPacketIAmHere) {
          if (find_it == discovered_peers_.end()) {
            discovered_peers_.push_back(DiscoveredPeer());
            discovered_peers_.back().set_ip_port(from);
            discovered_peers_.back().SetUserData(packet.user_data(),
                                                 packet.snapshot_index());
            discovered_peers_.back().set_last_updated(cur_time_ms);
          } else {
            bool update_user_data =
                ((*find_it).last_received_packet() < packet.snapshot_index());
            if (update_user_data) {
              (*find_it).SetUserData(packet.user_data(),
                                     packet.snapshot_index());
            }
            (*find_it).set_last_updated(cur_time_ms);
          }
        } else if (packet.packet_type() == kPacketIAmOutOfHere) {
          if (find_it != discovered_peers_.end()) {
            discovered_peers_.erase(find_it);
          }
        }

        lock_.Unlock();
      }
    }
  }